

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

string * __thiscall cppcms::http::response::get_header(response *this,string *name)

{
  string *psVar1;
  hold_ptr<cppcms::http::response::_data> *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  response_headers *in_stack_00000008;
  
  booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RSI);
  psVar1 = cppcms::impl::response_headers::get_header(in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  return in_RDI;
}

Assistant:

std::string response::get_header(std::string const &name)
{
	return d->headers.get_header(name);
}